

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool __thiscall
ON_SubD::DeleteMarkedComponentsForExperts
          (ON_SubD *this,bool bDeleteMarkedComponents,ON__UINT8 mark_bits,bool bDeleteIsolatedEdges,
          bool bUpdateTagsAndCoefficients,bool bMarkDeletedFaceEdges)

{
  bool bVar1;
  ON_SimpleArray<ON_SubDComponentPtr> cptr_list;
  ON_SimpleArray<ON_SubDComponentPtr> local_38;
  
  local_38._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00828990;
  local_38.m_a = (ON_SubDComponentPtr *)0x0;
  local_38.m_count = 0;
  local_38.m_capacity = 0;
  GetMarkedComponents(this,bDeleteMarkedComponents,mark_bits,true,true,true,&local_38);
  bVar1 = DeleteComponentsForExperts
                    (this,local_38.m_a,local_38._16_8_ & 0xffffffff,bDeleteIsolatedEdges,
                     bUpdateTagsAndCoefficients,bMarkDeletedFaceEdges);
  ON_SimpleArray<ON_SubDComponentPtr>::~ON_SimpleArray(&local_38);
  return bVar1;
}

Assistant:

bool ON_SubD::DeleteMarkedComponentsForExperts(
  bool bDeleteMarkedComponents,
  ON__UINT8 mark_bits,
  bool bDeleteIsolatedEdges,
  bool bUpdateTagsAndCoefficients,
  bool bMarkDeletedFaceEdges
)
{
  ON_SimpleArray<ON_SubDComponentPtr> cptr_list;
  GetMarkedComponents(bDeleteMarkedComponents, mark_bits, true, true, true, cptr_list);
  return DeleteComponentsForExperts(
    cptr_list.Array(),
    cptr_list.UnsignedCount(),
    bDeleteIsolatedEdges,
    bUpdateTagsAndCoefficients,
    bMarkDeletedFaceEdges
  );
}